

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int GmfCloseMesh(int64_t MshIdx)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  RecBlk((GmfMshSct *)MshIdx,*(void **)(MshIdx + 0x300428),0);
  if (*(int *)(MshIdx + 8) == 2) {
    if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
      GmfSetKwd(MshIdx,0x36,0);
    }
    else {
      fprintf(*(FILE **)(MshIdx + 0x300410),"\n%s\n",GmfKwdFmt[0x36][0]);
    }
  }
  uVar1 = *(uint *)(MshIdx + 0xc);
  iVar2 = fclose(*(FILE **)(MshIdx + 0x300410));
  lVar3 = 0x10c8;
  do {
    if (*(void **)(MshIdx + lVar3) != (void *)0x0) {
      free(*(void **)(MshIdx + lVar3));
    }
    lVar3 = lVar3 + 0x3300;
  } while (lVar3 != 0x3013c8);
  free((void *)MshIdx);
  return (uint)(byte)(iVar2 == 0 | (byte)((uVar1 & 2) >> 1));
}

Assistant:

int GmfCloseMesh(int64_t MshIdx)
{
   int i, res = 1;
   GmfMshSct *msh = (GmfMshSct *)MshIdx;

   RecBlk(msh, msh->buf, 0);

   // In write down the "End" kw in write mode
   if(msh->mod == GmfWrite)
   {
      if(msh->typ & Asc)
         fprintf(msh->hdl, "\n%s\n", GmfKwdFmt[ GmfEnd ][0]);
      else
         GmfSetKwd(MshIdx, GmfEnd, 0);
   }

   // Close the file and free the mesh structure
   if(msh->typ & Bin)
#ifdef WITH_GMF_AIO
      close(msh->FilDes);
#else
      fclose(msh->hdl);
#endif
   else if(fclose(msh->hdl))
      res = 0;

   // Free optional H.O. renumbering tables
   for(i=0;i<GmfLastKeyword;i++)
      if(msh->KwdTab[i].OrdTab)
         free(msh->KwdTab[i].OrdTab);

   free(msh);

   return(res);
}